

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.hpp
# Opt level: O3

void __thiscall
qclab::qgates::QControlledGate2<double>::setQubits(QControlledGate2<double> *this,int *qubits)

{
  int iVar1;
  undefined8 in_RAX;
  undefined8 in_RDX;
  char *__assertion;
  
  iVar1 = *qubits;
  if (iVar1 < 0) {
    __assertion = "qubits[0] >= 0";
  }
  else {
    if (-1 < qubits[1]) {
      if (iVar1 != qubits[1]) {
        this->control_ = iVar1;
        (*(this->super_QGate2<double>).super_QObject<double>._vptr_QObject[0x11])
                  (this,(ulong)(uint)qubits[1],in_RDX,in_RAX);
        return;
      }
      __assert_fail("qubits[0] != qubits[1]",
                    "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/QControlledGate2.hpp"
                    ,0x3a,
                    "virtual void qclab::qgates::QControlledGate2<double>::setQubits(const int *) [T = double]"
                   );
    }
    __assertion = "qubits[1] >= 0";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/QControlledGate2.hpp"
                ,0x39,
                "virtual void qclab::qgates::QControlledGate2<double>::setQubits(const int *) [T = double]"
               );
}

Assistant:

inline void setQubits( const int* qubits ) override {
          assert( qubits[0] >= 0 ) ; assert( qubits[1] >= 0 ) ;
          assert( qubits[0] != qubits[1] ) ;
          control_ = qubits[0] ;
          this->setTarget( qubits[1] ) ;
        }